

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O3

void sqlcheck::CheckStatement(Configuration *state,string *sql_statement)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  uint32_t uVar4;
  size_type sVar5;
  size_type sVar6;
  string statement;
  bool print_statement;
  string local_88;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_48;
  
  pcVar1 = (sql_statement->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + sql_statement->_M_string_length);
  sVar5 = local_88._M_string_length;
  _Var2._M_p = local_88._M_dataplus._M_p;
  if (local_88._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar6]);
      _Var2._M_p[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (sVar5 != sVar6);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_48,"^ +| +$|( ) +",0x10);
  local_60 = 0;
  local_58[0] = 0;
  local_68 = local_58;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_88._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_88._M_dataplus._M_p + local_88._M_string_length),&local_48,"$1",2,0);
  std::__cxx11::string::operator=((string *)&local_88,(string *)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_48);
  if (*local_88._M_dataplus._M_p == '\n') {
    std::__cxx11::string::erase((ulong)&local_88,0);
    std::__cxx11::string::_M_assign((string *)&local_88);
    state->line_number = state->line_number + 1;
  }
  local_68 = (undefined1 *)CONCAT71(local_68._1_7_,1);
  CheckMultiValuedAttribute(state,&local_88,(bool *)&local_68);
  CheckRecursiveDependency(state,&local_88,(bool *)&local_68);
  CheckPrimaryKeyExists(state,&local_88,(bool *)&local_68);
  CheckGenericPrimaryKey(state,&local_88,(bool *)&local_68);
  CheckForeignKeyExists(state,&local_88,(bool *)&local_68);
  CheckVariableAttribute(state,&local_88,(bool *)&local_68);
  CheckMetadataTribbles(state,&local_88,(bool *)&local_68);
  CheckFloat(state,&local_88,(bool *)&local_68);
  CheckValuesInDefinition(state,&local_88,(bool *)&local_68);
  CheckExternalFiles(state,&local_88,(bool *)&local_68);
  CheckIndexCount(state,&local_88,(bool *)&local_68);
  CheckIndexAttributeOrder(state,&local_88,(bool *)&local_68);
  CheckSelectStar(state,&local_88,(bool *)&local_68);
  CheckJoinWithoutEquality(state,&local_88,(bool *)&local_68);
  CheckNullUsage(state,&local_88,(bool *)&local_68);
  CheckNotNullUsage(state,&local_88,(bool *)&local_68);
  CheckConcatenation(state,&local_88,(bool *)&local_68);
  CheckGroupByUsage(state,&local_88,(bool *)&local_68);
  CheckOrderByRand(state,&local_88,(bool *)&local_68);
  CheckPatternMatching(state,&local_88,(bool *)&local_68);
  CheckSpaghettiQuery(state,&local_88,(bool *)&local_68);
  CheckJoinCount(state,&local_88,(bool *)&local_68);
  CheckDistinctCount(state,&local_88,(bool *)&local_68);
  CheckImplicitColumns(state,&local_88,(bool *)&local_68);
  CheckHaving(state,&local_88,(bool *)&local_68);
  CheckNesting(state,&local_88,(bool *)&local_68);
  CheckOr(state,&local_88,(bool *)&local_68);
  CheckUnion(state,&local_88,(bool *)&local_68);
  CheckDistinctJoin(state,&local_88,(bool *)&local_68);
  CheckReadablePasswords(state,&local_88,(bool *)&local_68);
  if (local_88._M_string_length != 0) {
    uVar4 = state->line_number;
    sVar5 = 0;
    do {
      if (local_88._M_dataplus._M_p[sVar5] == '\n') {
        uVar4 = uVar4 + 1;
        state->line_number = uVar4;
      }
      sVar5 = sVar5 + 1;
    } while (local_88._M_string_length != sVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CheckStatement(Configuration& state,
                    const std::string& sql_statement){

  // TRANSFORM TO LOWER CASE
  auto statement = sql_statement;

  std::transform(statement.begin(),
                 statement.end(),
                 statement.begin(),
                 ::tolower);

  // REMOVE SPACE
  statement = std::regex_replace(statement, std::regex("^ +| +$|( ) +"), "$1");

  // CHECK FOR LEADING NEWLINE
  if (statement[0] == '\n') {
    statement = statement.erase(0,1);
    state.line_number++;
  }

  // RESET
  bool print_statement = true;

  // LOGICAL DATABASE DESIGN

  CheckMultiValuedAttribute(state, statement, print_statement);

  CheckRecursiveDependency(state, statement, print_statement);

  CheckPrimaryKeyExists(state, statement, print_statement);

  CheckGenericPrimaryKey(state, statement, print_statement);

  CheckForeignKeyExists(state, statement, print_statement);

  CheckVariableAttribute(state, statement, print_statement);

  CheckMetadataTribbles(state, statement, print_statement);

  // PHYSICAL DATABASE DESIGN

  CheckFloat(state, statement, print_statement);

  CheckValuesInDefinition(state, statement, print_statement);

  CheckExternalFiles(state, statement, print_statement);

  CheckIndexCount(state, statement, print_statement);

  CheckIndexAttributeOrder(state, statement, print_statement);

  // QUERY

  CheckSelectStar(state, statement, print_statement);

  CheckJoinWithoutEquality(state, statement, print_statement);

  CheckNullUsage(state, statement, print_statement);

  CheckNotNullUsage(state, statement, print_statement);

  CheckConcatenation(state, statement, print_statement);

  CheckGroupByUsage(state, statement, print_statement);

  CheckOrderByRand(state, statement, print_statement);

  CheckPatternMatching(state, statement, print_statement);

  CheckSpaghettiQuery(state, statement, print_statement);

  CheckJoinCount(state, statement, print_statement);

  CheckDistinctCount(state, statement, print_statement);

  CheckImplicitColumns(state, statement, print_statement);

  CheckHaving(state, statement, print_statement);

  CheckNesting(state, statement, print_statement);

  CheckOr(state, statement, print_statement);

  CheckUnion(state, statement, print_statement);

  CheckDistinctJoin(state, statement, print_statement);

  // APPLICATION

  CheckReadablePasswords(state, statement, print_statement);




  // update state.line_number with number of line breaks in the statement that was just checked
  for (size_t i = 0; i < statement.length(); i++)
  {
      if (statement[i] == '\n')
      {
          state.line_number++;
      }
  }
}